

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Done_Face(FT_Face face)

{
  FT_Driver driver_00;
  FT_Memory memory_00;
  FT_ListNode node_00;
  FT_ListNode node;
  FT_Memory memory;
  FT_Driver driver;
  FT_Error error;
  FT_Face face_local;
  
  driver._4_4_ = 0x23;
  if ((face != (FT_Face)0x0) && (face->driver != (FT_Driver)0x0)) {
    face->internal->refcount = face->internal->refcount + -1;
    if (face->internal->refcount < 1) {
      driver_00 = face->driver;
      memory_00 = (driver_00->root).memory;
      node_00 = FT_List_Find(&driver_00->faces_list,face);
      if (node_00 != (FT_ListNode)0x0) {
        FT_List_Remove(&driver_00->faces_list,node_00);
        ft_mem_free(memory_00,node_00);
        destroy_face(memory_00,face,driver_00);
        driver._4_4_ = 0;
      }
    }
    else {
      driver._4_4_ = 0;
    }
  }
  return driver._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Done_Face( FT_Face  face )
  {
    FT_Error     error;
    FT_Driver    driver;
    FT_Memory    memory;
    FT_ListNode  node;


    error = FT_ERR( Invalid_Face_Handle );
    if ( face && face->driver )
    {
      face->internal->refcount--;
      if ( face->internal->refcount > 0 )
        error = FT_Err_Ok;
      else
      {
        driver = face->driver;
        memory = driver->root.memory;

        /* find face in driver's list */
        node = FT_List_Find( &driver->faces_list, face );
        if ( node )
        {
          /* remove face object from the driver's list */
          FT_List_Remove( &driver->faces_list, node );
          FT_FREE( node );

          /* now destroy the object proper */
          destroy_face( memory, face, driver );
          error = FT_Err_Ok;
        }
      }
    }

    return error;
  }